

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O3

monst * restmonchn(memfile *mf,level *lev,boolean ghostly)

{
  boolean bVar1;
  int32_t iVar2;
  int mndx;
  uint uVar3;
  monst *shkp;
  obj *poVar4;
  obj *poVar5;
  monst *pmVar6;
  monst *pmVar7;
  monst *pmVar8;
  
  mfmagic_check(mf,0x4e48434d);
  iVar2 = mread32(mf);
  if (iVar2 != 0) {
    pmVar7 = (monst *)0x0;
    pmVar8 = (monst *)0x0;
    do {
      shkp = restore_mon(mf);
      pmVar6 = shkp;
      if (pmVar7 != (monst *)0x0) {
        pmVar8->nmon = shkp;
        pmVar6 = pmVar7;
      }
      shkp->dlevel = lev;
      uVar3 = flags.ident;
      if (ghostly != '\0') {
        flags.ident = flags.ident + 1;
        add_id_mapping(shkp->m_id,uVar3);
        shkp->m_id = uVar3;
        mndx = monsndx(shkp->data);
        bVar1 = propagate(mndx,'\x01',ghostly);
        if (bVar1 == '\0') {
          shkp->mhpmax = -100;
        }
      }
      poVar5 = (obj *)&shkp->minvent;
      if (shkp->minvent != (obj *)0x0) {
        poVar4 = restobjchn(mf,lev,ghostly,'\0');
        *(obj **)poVar5 = poVar4;
        for (; poVar4 != (obj *)0x0; poVar4 = poVar4->nobj) {
          (poVar4->v).v_ocarry = shkp;
        }
      }
      if (shkp->mw != (obj *)0x0) {
        do {
          poVar5 = poVar5->nobj;
          if (poVar5 == (obj *)0x0) {
            shkp->mw = (obj *)0x0;
            impossible("bad monster weapon restore");
            goto LAB_00235ae9;
          }
        } while ((poVar5->owornmask & 0x100) == 0);
        shkp->mw = poVar5;
      }
LAB_00235ae9:
      uVar3 = *(uint *)&shkp->field_0x60;
      if ((uVar3 >> 0x19 & 1) != 0) {
        restshk(shkp,ghostly);
        uVar3 = *(uint *)&shkp->field_0x60;
      }
      if ((uVar3 >> 0x1c & 1) != 0) {
        restpriest(shkp,ghostly);
      }
      iVar2 = iVar2 + -1;
      pmVar7 = pmVar6;
      pmVar8 = shkp;
    } while (iVar2 != 0);
    if (pmVar6 != (monst *)0x0) {
      if (shkp->nmon == (monst *)0x0) {
        return pmVar6;
      }
      impossible("Restmonchn: error reading monchn.");
      shkp->nmon = (monst *)0x0;
      return pmVar6;
    }
  }
  return (monst *)0x0;
}

Assistant:

static struct monst *restmonchn(struct memfile *mf, struct level *lev, boolean ghostly)
{
	struct monst *mtmp, *mtmp2 = NULL;
	struct monst *first = NULL;
	struct obj *obj;
	unsigned int count, mndx;

	/* get the original base address */
	mfmagic_check(mf, MONCHAIN_MAGIC);
	count = mread32(mf);

	while (count--) {
	    mtmp = restore_mon(mf);
	    if (!first)
		first = mtmp;
	    else
		mtmp2->nmon = mtmp;
	    mtmp->dlevel = lev;
	    
	    if (ghostly) {
		unsigned nid = flags.ident++;
		add_id_mapping(mtmp->m_id, nid);
		mtmp->m_id = nid;

		mndx = monsndx(mtmp->data);
		if (propagate(mndx, TRUE, ghostly) == 0) {
		    /* cookie to trigger purge in getbones() */
		    mtmp->mhpmax = DEFUNCT_MONSTER;	
		}
	    }
	    
	    if (mtmp->minvent) {
		mtmp->minvent = restobjchn(mf, lev, ghostly, FALSE);
		/* restore monster back pointer */
		for (obj = mtmp->minvent; obj; obj = obj->nobj)
		    obj->ocarry = mtmp;
	    }
	    
	    if (mtmp->mw) {
		for (obj = mtmp->minvent; obj; obj = obj->nobj)
		    if (obj->owornmask & W_WEP) break;
		if (obj) mtmp->mw = obj;
		else {
		    MON_NOWEP(mtmp);
		    impossible("bad monster weapon restore");
		}
	    }

	    if (mtmp->isshk) restshk(mtmp, ghostly);
	    if (mtmp->ispriest) restpriest(mtmp, ghostly);

	    mtmp2 = mtmp;
	}
	if (first && mtmp2->nmon){
	    impossible("Restmonchn: error reading monchn.");
	    mtmp2->nmon = 0;
	}
	
	return first;
}